

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MicroString::ClearToDefault
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  uint uVar1;
  char *pcVar2;
  MicroString *pMVar3;
  Arena *in_R8;
  string_view data;
  
  if (arena != (Arena *)0x0) {
    pcVar2 = (unowned_input->payload).payload;
    uVar1 = (unowned_input->payload).size;
    pMVar3 = (MicroString *)Capacity(this);
    if ((MicroString *)(ulong)uVar1 <= pMVar3) {
      data._M_str = (char *)arena;
      data._M_len = (size_t)pcVar2;
      SetMaybeConstant<google::protobuf::internal::MicroString>
                (this,(MicroString *)(ulong)uVar1,data,in_R8);
      return;
    }
  }
  SetUnowned(this,unowned_input,arena);
  return;
}

Assistant:

void MicroString::ClearToDefault(const UnownedPayload& unowned_input,
                                 Arena* arena) {
  auto input = unowned_input.get();
  if (arena != nullptr && Capacity() >= input.size()) {
    // If we are in an arena and the input fits in the existing capacity, use
    // that instead.
    Set(input, arena);
  } else {
    SetUnowned(unowned_input, arena);
  }
}